

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlspwin.c
# Opt level: O2

void lisp_Xvideocolor(int flag)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  XGCValues gcv;
  undefined4 local_d8 [8];
  Window local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  
  memset(local_d8,0,0xc0);
  gcv.clip_mask = 0;
  gcv.dash_offset = 0;
  gcv.dashes = '\0';
  gcv._125_3_ = 0;
  gcv.subwindow_mode = 0;
  gcv.graphics_exposures = 0;
  gcv.clip_x_origin = 0;
  gcv.clip_y_origin = 0;
  gcv.ts_x_origin = 0;
  gcv.ts_y_origin = 0;
  gcv.font = 0;
  gcv.tile = 0;
  gcv.stipple = 0;
  gcv.fill_style = 0;
  gcv.fill_rule = 0;
  gcv.arc_mode = 0;
  gcv._60_4_ = 0;
  gcv.line_width = 0;
  gcv.line_style = 0;
  gcv.cap_style = 0;
  gcv.join_style = 0;
  gcv.foreground = 0;
  gcv.background = 0;
  gcv.function = 0;
  gcv._4_4_ = 0;
  gcv.plane_mask = 0;
  puVar2 = &foregroundPixel;
  if (flag != 0) {
    puVar2 = &backgroundPixel;
  }
  uVar1 = *puVar2;
  XGetGCValues(currentdsp->display_id,currentdsp->Copy_GC,0xc,&gcv);
  if (uVar1 != gcv.foreground) {
    gcv.background = gcv.foreground;
    gcv.foreground = uVar1;
    XChangeGC(currentdsp->display_id,currentdsp->Copy_GC,0xc);
    local_d8[0] = 0xc;
    local_b8 = currentdsp->DisplayWindow;
    local_b0 = 0;
    local_a8._0_4_ = (currentdsp->Visible).width;
    local_a8._4_4_ = (currentdsp->Visible).height;
    XSendEvent(currentdsp->display_id,local_b8,1,0);
  }
  XFlush(currentdsp->display_id);
  return;
}

Assistant:

void lisp_Xvideocolor(int flag)
{
  XEvent event = {0};
  XGCValues gcv = {0};
  unsigned long newForeground;

  XLOCK;
  newForeground = flag ? backgroundPixel : foregroundPixel;

  /* window -- are we making a change? */
  XGetGCValues(currentdsp->display_id, currentdsp->Copy_GC, GCForeground | GCBackground, &gcv);
  if (newForeground != gcv.foreground) {
      /* swap foreground and background in the graphics context*/
      gcv.background = gcv.foreground;
      gcv.foreground = newForeground;
      XChangeGC(currentdsp->display_id, currentdsp->Copy_GC, GCForeground | GCBackground, &gcv);
      /* notify the display code to refresh the visible screen with new fg/bg colors */
      event.type = Expose;
      event.xexpose.window = currentdsp->DisplayWindow;
      event.xexpose.x = 0;
      event.xexpose.y = 0;
      event.xexpose.width = (int)currentdsp->Visible.width;
      event.xexpose.height = (int)currentdsp->Visible.height;
      XSendEvent(currentdsp->display_id, currentdsp->DisplayWindow, True, 0, &event);
  }

  XFlush(currentdsp->display_id);
  XUNLOCK(currentdsp);

}